

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnf_reader.c
# Opt level: O0

int satoko_parse_dimacs(char *fname,satoko_t **solver)

{
  vec_uint_t *s;
  uint size;
  int iVar1;
  ushort **ppuVar2;
  uint *lits_00;
  char *local_48;
  char *token;
  char *buffer;
  int n_clause;
  int n_var;
  vec_uint_t *lits;
  satoko_t *p;
  satoko_t **solver_local;
  char *fname_local;
  
  lits = (vec_uint_t *)0x0;
  _n_clause = (vec_uint_t *)0x0;
  p = (satoko_t *)solver;
  solver_local = (satoko_t **)fname;
  local_48 = file_open(fname);
  token = local_48;
  if (local_48 == (char *)0x0) {
    fname_local._4_4_ = -1;
  }
  else {
    do {
      while( true ) {
        while( true ) {
          skip_spaces(&local_48);
          if (*local_48 == '\0') {
            vec_uint_free(_n_clause);
            free(token);
            *(vec_uint_t **)p = lits;
            return 1;
          }
          if (*local_48 != 'c') break;
          skip_line(&local_48);
        }
        if (*local_48 != 'p') break;
        local_48 = local_48 + 1;
        skip_spaces(&local_48);
        while (ppuVar2 = __ctype_b_loc(), ((*ppuVar2)[(int)*local_48] & 0x2000) == 0) {
          local_48 = local_48 + 1;
        }
        buffer._4_4_ = read_int(&local_48);
        buffer._0_4_ = read_int(&local_48);
        skip_line(&local_48);
        _n_clause = vec_uint_alloc(buffer._4_4_);
        lits = (vec_uint_t *)satoko_create();
      }
      if (_n_clause == (vec_uint_t *)0x0) {
        printf("There is no parameter line.\n");
        free(token);
        return -1;
      }
      read_clause(&local_48,_n_clause);
      s = lits;
      lits_00 = vec_uint_data(_n_clause);
      size = vec_uint_size(_n_clause);
      iVar1 = satoko_add_clause((solver_t *)s,(int *)lits_00,size);
    } while (iVar1 != 0);
    printf("Unable to add clause: ");
    vec_uint_print(_n_clause);
    fname_local._4_4_ = 0;
  }
  return fname_local._4_4_;
}

Assistant:

int satoko_parse_dimacs(char *fname, satoko_t **solver)
{
    satoko_t *p = NULL;
    vec_uint_t *lits = NULL;
    int n_var;
    int n_clause;
    char *buffer = file_open(fname);
    char *token;

    if (buffer == NULL)
        return -1;

    token = buffer;
    while (1) {
        skip_spaces(&token);
        if (*token == 0)
            break;
        else if (*token == 'c')
            skip_line(&token);
        else if (*token == 'p') {
            token++;
            skip_spaces(&token);
            for(; !isspace(*token); token++); /* skip 'cnf' */

            n_var = read_int(&token);
            n_clause = read_int(&token);
            skip_line(&token);
            lits = vec_uint_alloc((unsigned) n_var);
            p = satoko_create();
        } else {
            if (lits == NULL) {
                printf("There is no parameter line.\n");
                satoko_free(buffer);
                return -1;
            }
            read_clause(&token, lits);
            if (!satoko_add_clause(p, (int*)vec_uint_data(lits), vec_uint_size(lits))) {
                printf("Unable to add clause: ");
                vec_uint_print(lits);
                return SATOKO_ERR;
            }
            }
    }
    vec_uint_free(lits);
    satoko_free(buffer);
    *solver = p;
    return SATOKO_OK;
}